

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

size_t __thiscall
ddd::DaTrie<false,_false,_true>::edge_size_
          (DaTrie<false,_false,_true> *this,uint32_t node_pos,size_t upper)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  const_reference pvVar4;
  ulong in_RDX;
  uint in_ESI;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_RDI;
  uint32_t child_pos;
  uint32_t label;
  size_t size;
  uint32_t base;
  uint local_34;
  ulong local_30;
  ulong local_8;
  
  pvVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)in_ESI);
  bVar1 = Bc::is_fixed(pvVar4);
  if (!bVar1) {
    __assert_fail("bc_[node_pos].is_fixed()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x3f8,
                  "size_t ddd::DaTrie<false, false, true>::edge_size_(uint32_t, size_t) const [WithBLM = false, WithNLM = false, Prefix = true]"
                 );
  }
  pvVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)in_ESI);
  bVar1 = Bc::is_leaf(pvVar4);
  if (bVar1) {
    local_8 = 0;
  }
  else {
    pvVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)in_ESI);
    uVar2 = Bc::base(pvVar4);
    if (uVar2 == 0x7fffffff) {
      local_8 = 0;
    }
    else {
      local_30 = 0;
      for (local_34 = 0; local_34 < 0x100; local_34 = local_34 + 1) {
        pvVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                           (in_RDI,(ulong)(uVar2 ^ local_34));
        uVar3 = Bc::check(pvVar4);
        if ((uVar3 == in_ESI) && (local_30 = local_30 + 1, in_RDX <= local_30)) break;
      }
      local_8 = local_30;
    }
  }
  return local_8;
}

Assistant:

size_t edge_size_(uint32_t node_pos, size_t upper = 256) const {
    assert(bc_[node_pos].is_fixed());

    if (bc_[node_pos].is_leaf()) {
      return 0;
    }

    auto base = bc_[node_pos].base();
    if (base == INVALID_VALUE) { // for prefix subtrie
      return 0;
    }

    size_t size = 0;
    if (WithNLM) {
      auto child_pos = base ^node_links_[node_pos].child;
      while (++size < upper && node_links_[child_pos].sib != node_links_[node_pos].child) {
        child_pos = base ^ node_links_[child_pos].sib;
      }
    } else {
      for (uint32_t label = 0; label < 256; ++label) {
        auto child_pos = base ^label;
        if (bc_[child_pos].check() == node_pos && ++size >= upper) {
          break;
        }
      }
    }
    return size;
  }